

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.cpp
# Opt level: O3

directory * __thiscall
dlib::directory::get_parent(directory *__return_storage_ptr__,directory *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  long lVar4;
  string *psVar5;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  paVar1 = &(__return_storage_ptr__->state).full_name.field_2;
  sVar2 = (this->state).name._M_string_length;
  (__return_storage_ptr__->state).name._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->state).name.field_2;
  if (sVar2 == 0) {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,(this->state).name._M_dataplus._M_p);
    (__return_storage_ptr__->state).full_name._M_dataplus._M_p = (pointer)paVar1;
    pcVar3 = (this->state).full_name._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->state).full_name,pcVar3,
               pcVar3 + (this->state).full_name._M_string_length);
  }
  else {
    (__return_storage_ptr__->state).name._M_string_length = 0;
    (__return_storage_ptr__->state).name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->state).full_name._M_dataplus._M_p = (pointer)paVar1;
    (__return_storage_ptr__->state).full_name._M_string_length = 0;
    (__return_storage_ptr__->state).full_name.field_2._M_local_buf[0] = '\0';
    psVar5 = &(this->state).full_name;
    std::__cxx11::string::rfind((char)psVar5,0x2f);
    std::__cxx11::string::substr((ulong)local_40,(ulong)psVar5);
    psVar5 = &(__return_storage_ptr__->state).full_name;
    std::__cxx11::string::operator=((string *)psVar5,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    if ((((__return_storage_ptr__->state).full_name._M_string_length != 1) ||
        (*(psVar5->_M_dataplus)._M_p != '/')) &&
       (lVar4 = std::__cxx11::string::rfind((char)psVar5,0x2f), lVar4 != -1)) {
      std::__cxx11::string::substr((ulong)local_40,(ulong)psVar5);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_40);
      if (local_40[0] == local_30) {
        return __return_storage_ptr__;
      }
      operator_delete(local_40[0]);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::push_back((char)psVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

const directory directory::
    get_parent (
    ) const
    {
        using namespace std;
        // if *this is the root then just return *this
        if (is_root())
        {
            return *this;
        }
        else
        {
            directory temp;

            const char sep = get_separator();

            string::size_type pos = state.full_name.find_last_of(sep);
            temp.state.full_name = state.full_name.substr(0,pos);

            if ( is_root_path(temp.state.full_name))
            {
                temp.state.full_name += sep;
            }
            else
            {
                pos = temp.state.full_name.find_last_of(sep);
                if (pos != string::npos)
                {
                    temp.state.name = temp.state.full_name.substr(pos+1);
                }
                else
                {
                    temp.state.full_name += sep;
                }
            }
            return temp;
        }
    }